

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_dirhie.c
# Opt level: O0

CURLcode create_dir_hierarchy(char *outfile,FILE *errors)

{
  int iVar1;
  size_t sVar2;
  char *__s;
  char *__s_00;
  char *pcVar3;
  size_t sVar4;
  int *piVar5;
  size_t dlen;
  size_t outlen;
  CURLcode result;
  char *dirbuildup;
  char *outdup;
  char *tempdir2;
  char *tempdir;
  FILE *errors_local;
  char *outfile_local;
  
  outlen._4_4_ = CURLE_OK;
  sVar2 = strlen(outfile);
  __s = strdup(outfile);
  if (__s == (char *)0x0) {
    outfile_local._4_4_ = CURLE_OUT_OF_MEMORY;
  }
  else {
    __s_00 = (char *)malloc(sVar2 + 1);
    if (__s_00 == (char *)0x0) {
      free(__s);
      outfile_local._4_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      *__s_00 = '\0';
      pcVar3 = strtok(__s,"/");
      do {
        do {
          tempdir2 = pcVar3;
          if (tempdir2 == (char *)0x0) goto LAB_0010df43;
          pcVar3 = strtok((char *)0x0,"/");
        } while (pcVar3 == (char *)0x0);
        sVar4 = strlen(__s_00);
        if (sVar4 == 0) {
          if (__s == tempdir2) {
            strcpy(__s_00,tempdir2);
          }
          else {
            curl_msnprintf(__s_00,sVar2,"%s%s","/",tempdir2);
          }
        }
        else {
          curl_msnprintf(__s_00 + sVar4,sVar2 - sVar4,"%s%s","/",tempdir2);
        }
        iVar1 = mkdir(__s_00,0x1e8);
      } while ((iVar1 != -1) || (piVar5 = __errno_location(), *piVar5 == 0x11));
      show_dir_errno(errors,__s_00);
      outlen._4_4_ = CURLE_WRITE_ERROR;
LAB_0010df43:
      free(__s_00);
      free(__s);
      outfile_local._4_4_ = outlen._4_4_;
    }
  }
  return outfile_local._4_4_;
}

Assistant:

CURLcode create_dir_hierarchy(const char *outfile, FILE *errors)
{
  char *tempdir;
  char *tempdir2;
  char *outdup;
  char *dirbuildup;
  CURLcode result = CURLE_OK;
  size_t outlen;

  outlen = strlen(outfile);
  outdup = strdup(outfile);
  if(!outdup)
    return CURLE_OUT_OF_MEMORY;

  dirbuildup = malloc(outlen + 1);
  if(!dirbuildup) {
    Curl_safefree(outdup);
    return CURLE_OUT_OF_MEMORY;
  }
  dirbuildup[0] = '\0';

  /* Allow strtok() here since this isn't used threaded */
  /* !checksrc! disable BANNEDFUNC 2 */
  tempdir = strtok(outdup, PATH_DELIMITERS);

  while(tempdir != NULL) {
    tempdir2 = strtok(NULL, PATH_DELIMITERS);
    /* since strtok returns a token for the last word even
       if not ending with DIR_CHAR, we need to prune it */
    if(tempdir2 != NULL) {
      size_t dlen = strlen(dirbuildup);
      if(dlen)
        snprintf(&dirbuildup[dlen], outlen - dlen, "%s%s", DIR_CHAR, tempdir);
      else {
        if(outdup == tempdir)
          /* the output string doesn't start with a separator */
          strcpy(dirbuildup, tempdir);
        else
          snprintf(dirbuildup, outlen, "%s%s", DIR_CHAR, tempdir);
      }
      if((-1 == mkdir(dirbuildup, (mode_t)0000750)) && (errno != EEXIST)) {
        show_dir_errno(errors, dirbuildup);
        result = CURLE_WRITE_ERROR;
        break; /* get out of loop */
      }
    }
    tempdir = tempdir2;
  }

  Curl_safefree(dirbuildup);
  Curl_safefree(outdup);

  return result;
}